

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

Gia_Man_t *
Gia_ManSpecReduceInitFrames
          (Gia_Man_t *p,Abc_Cex_t *pInit,int nFramesMax,int *pnFrames,int fDualOut,int nMinOutputs)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *p_00;
  int nFrames;
  
  iVar1 = Gia_ManEquivCountLits(p);
  nFrames = 1;
  do {
    p_00 = Gia_ManSpecReduceInit(p,pInit,nFrames,fDualOut);
    iVar2 = p_00->vCos->nSize - p_00->nRegs;
    if (nMinOutputs == 0) {
      if ((nFramesMax == nFrames) || (iVar1 / 2 < iVar2)) {
LAB_001e4015:
        if (nFramesMax == nFrames) {
          Abc_Print(1,"Stopped unrolling after %d frames.\n",(ulong)(uint)nFramesMax);
        }
        if (pnFrames == (int *)0x0) {
          return p_00;
        }
        *pnFrames = nFrames;
        return p_00;
      }
    }
    else if ((nFramesMax == nFrames) || (nMinOutputs <= iVar2)) goto LAB_001e4015;
    iVar2 = Gia_ManAndNum(p_00);
    Gia_ManStop(p_00);
    if (500000 < iVar2) {
      return (Gia_Man_t *)0x0;
    }
    nFrames = nFrames + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManSpecReduceInitFrames( Gia_Man_t * p, Abc_Cex_t * pInit, int nFramesMax, int * pnFrames, int fDualOut, int nMinOutputs )
{
    Gia_Man_t * pFrames;
    int f, nLits;
    nLits = Gia_ManEquivCountLits( p );
    for ( f = 1; ; f++ )
    {
        pFrames = Gia_ManSpecReduceInit( p, pInit, f, fDualOut );
        if ( (nMinOutputs == 0 && Gia_ManPoNum(pFrames) >= nLits/2+1) ||
             (nMinOutputs != 0 && Gia_ManPoNum(pFrames) >= nMinOutputs) )
            break;
        if ( f == nFramesMax )
            break;
        if ( Gia_ManAndNum(pFrames) > 500000 )
        {
            Gia_ManStop( pFrames );
            return NULL;
        }
        Gia_ManStop( pFrames );
        pFrames = NULL;
    }
    if ( f == nFramesMax )
        Abc_Print( 1, "Stopped unrolling after %d frames.\n", nFramesMax );
    if ( pnFrames )
        *pnFrames = f;
    return pFrames;
}